

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

void MallocBlock::CheckForCorruptedBuffer
               (MallocBlockQueueEntry *queue_entry,size_t buffer_idx,uchar *buffer,
               size_t size_of_buffer)

{
  MallocBlock *pMVar1;
  size_t sVar2;
  int iVar3;
  MallocBlockQueueEntry *in_RAX;
  ulong uVar4;
  MallocBlockQueueEntry *local_38;
  
  local_38 = in_RAX;
  iVar3 = bcmp(buffer,kMagicDeletedBuffer,size_of_buffer);
  if (iVar3 != 0) {
    RAW_LOG(-3,
            "Found a corrupted memory buffer in MallocBlock (may be offset from user ptr): buffer index: %zd, buffer ptr: %p, size of buffer: %zd"
            ,buffer_idx,buffer,size_of_buffer);
    if (size_of_buffer < 0x401) {
      if (size_of_buffer != 0) {
        uVar4 = 0;
        do {
          if (buffer[uVar4] != 0xcd) {
            RAW_LOG(-3,"Buffer byte %d is 0x%02x (should be 0x%02x).",uVar4 & 0xffffffff,
                    (ulong)buffer[uVar4],0xcd);
          }
          uVar4 = uVar4 + 1;
        } while (size_of_buffer != uVar4);
      }
    }
    else {
      RAW_LOG(-3,"Buffer too large to print corruption.");
    }
    pMVar1 = queue_entry->block;
    sVar2 = queue_entry->size;
    if (queue_entry->num_deleter_pcs < 1) {
      RAW_LOG(-3,
              "Skipping the printing of the deleter\'s stack!  Its stack was not found; either the corruption occurred too early in execution to obtain a stack trace or --max_free_queue_size was set to 0."
             );
    }
    else {
      TracePrintf(2,"Deleted by thread %zx\n",queue_entry->deleter_threadid);
      local_38 = queue_entry;
      tcmalloc::ThreadCachePtr::WithStacktraceScope
                (anon_func::anon_class_1_0_00000001::__invoke,&local_38);
    }
    RAW_LOG(-4,
            "Memory was written to after being freed.  MallocBlock: %p, user ptr: %p, size: %zd.  If you can\'t find the source of the error, try using ASan (https://github.com/google/sanitizers), Valgrind, or Purify, or study the output of the deleter\'s stack printed above."
            ,pMVar1,pMVar1->size_and_magic2_,sVar2);
  }
  return;
}

Assistant:

static void CheckForCorruptedBuffer(const MallocBlockQueueEntry& queue_entry,
                                      size_t buffer_idx,
                                      const unsigned char* buffer,
                                      size_t size_of_buffer) {
    if (memcmp(buffer, kMagicDeletedBuffer, size_of_buffer) == 0) {
      return;
    }

    RAW_LOG(ERROR,
            "Found a corrupted memory buffer in MallocBlock (may be offset "
            "from user ptr): buffer index: %zd, buffer ptr: %p, size of "
            "buffer: %zd", buffer_idx, buffer, size_of_buffer);

    // The magic deleted buffer should only be 1024 bytes, but in case
    // this changes, let's put an upper limit on the number of debug
    // lines we'll output:
    if (size_of_buffer <= 1024) {
      for (int i = 0; i < size_of_buffer; ++i) {
        if (buffer[i] != kMagicDeletedByte) {
          RAW_LOG(ERROR, "Buffer byte %d is 0x%02x (should be 0x%02x).",
                  i, buffer[i], kMagicDeletedByte);
        }
      }
    } else {
      RAW_LOG(ERROR, "Buffer too large to print corruption.");
    }

    const MallocBlock* b = queue_entry.block;
    const size_t size = queue_entry.size;
    if (queue_entry.num_deleter_pcs > 0) {
      TracePrintf(STDERR_FILENO, "Deleted by thread %zx\n",
                  queue_entry.deleter_threadid);

      ThreadCachePtr::WithStacktraceScope([&] (bool stacktrace_allowed) {
        tcmalloc::DumpStackTraceToStderr(queue_entry.deleter_pcs, queue_entry.num_deleter_pcs,
                                         FLAGS_symbolize_stacktrace,
                                         "    @ ");
      });
    } else {
      RAW_LOG(ERROR,
              "Skipping the printing of the deleter's stack!  Its stack was "
              "not found; either the corruption occurred too early in "
              "execution to obtain a stack trace or --max_free_queue_size was "
              "set to 0.");
    }

    RAW_LOG(FATAL,
            "Memory was written to after being freed.  MallocBlock: %p, user "
            "ptr: %p, size: %zd.  If you can't find the source of the error, "
            "try using ASan (https://github.com/google/sanitizers), "
            "Valgrind, or Purify, or study the "
            "output of the deleter's stack printed above.",
            b, b->data_addr(), size);
  }